

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O2

void Omega_h::project_classification
               (Mesh *mesh,Int ent_dim,Write<signed_char> *class_dim,Write<int> *class_id,
               bool relaxed)

{
  int iVar1;
  element_type *peVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  Write<signed_char> local_1d8;
  Write<int> local_1c8;
  Write<int> local_1b8;
  Write<int> local_1a8;
  Write<signed_char> local_198;
  Write<int> local_188;
  undefined8 local_178;
  Read<int> high_class_id;
  Read<signed_char> high_class_dim;
  LOs lh2h;
  LOs l2lh;
  Write<signed_char> local_130;
  Write<int> local_120;
  Write<int> local_110;
  Write<int> local_100;
  Write<signed_char> local_f0;
  Write<int> local_e0;
  element_type *local_d0;
  type f;
  Adj l2h;
  
  uVar9 = ent_dim + 1;
  Mesh::ask_up(&l2h,mesh,ent_dim,uVar9);
  Write<int>::Write(&l2lh.write_,(Write<int> *)&l2h);
  Write<int>::Write(&lh2h.write_,&l2h.super_Graph.ab2b.write_);
  std::__cxx11::string::string((string *)&local_1d8,"class_dim",(allocator *)&local_130);
  Mesh::get_array<signed_char>((Mesh *)&high_class_dim,(Int)mesh,(string *)(ulong)uVar9);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::string((string *)&local_1d8,"class_id",(allocator *)&local_130);
  Mesh::get_array<int>((Mesh *)&high_class_id,(Int)mesh,(string *)(ulong)uVar9);
  std::__cxx11::string::~string((string *)&local_1d8);
  Write<signed_char>::Write(&f.class_dim,class_dim);
  Write<int>::Write(&f.class_id,class_id);
  Write<int>::Write(&f.l2lh.write_,&l2lh.write_);
  Write<int>::Write(&f.lh2h.write_,&lh2h.write_);
  Write<signed_char>::Write(&f.high_class_dim.write_,&high_class_dim.write_);
  Write<int>::Write(&f.high_class_id.write_,&high_class_id.write_);
  f.relaxed = relaxed;
  f.ent_dim = ent_dim;
  uVar9 = Mesh::nents(mesh,ent_dim);
  Write<signed_char>::Write(&local_130,&f.class_dim);
  Write<int>::Write(&local_120,&f.class_id);
  Write<int>::Write(&local_110,&f.l2lh.write_);
  Write<int>::Write(&local_100,&f.lh2h.write_);
  Write<signed_char>::Write(&local_f0,&f.high_class_dim.write_);
  Write<int>::Write(&local_e0,&f.high_class_id.write_);
  local_d0 = (element_type *)CONCAT44(f.ent_dim,f._96_4_);
  if (0 < (int)uVar9) {
    entering_parallel = 1;
    Write<signed_char>::Write(&local_1d8,&local_130);
    Write<int>::Write(&local_1c8,&local_120);
    Write<int>::Write(&local_1b8,&local_110);
    Write<int>::Write(&local_1a8,&local_100);
    Write<signed_char>::Write(&local_198,&local_f0);
    Write<int>::Write(&local_188,&local_e0);
    local_178 = local_d0;
    peVar2 = local_178;
    entering_parallel = 0;
    for (uVar3 = 0; uVar3 != uVar9; uVar3 = uVar3 + 1) {
      iVar4 = (int)*(char *)((long)local_1d8.shared_alloc_.direct_ptr + uVar3);
      iVar6 = *(int *)((long)local_1c8.shared_alloc_.direct_ptr + uVar3 * 4);
      lVar8 = (long)*(int *)((long)local_1b8.shared_alloc_.direct_ptr + uVar3 * 4);
      local_178._0_1_ = (byte)local_d0;
      iVar7 = 0;
      while( true ) {
        if (*(int *)((long)local_1b8.shared_alloc_.direct_ptr + uVar3 * 4 + 4) <= lVar8) break;
        lVar10 = (long)*(int *)((long)local_1a8.shared_alloc_.direct_ptr + lVar8 * 4);
        iVar5 = (int)*(char *)((long)local_198.shared_alloc_.direct_ptr + lVar10);
        iVar1 = *(int *)((long)local_188.shared_alloc_.direct_ptr + lVar10 * 4);
        if (iVar5 < iVar4) {
          iVar7 = 1;
          iVar4 = iVar5;
          iVar6 = iVar1;
        }
        else if (iVar4 == iVar5) {
          if ((iVar1 == iVar6) || ((iVar1 == -1 & (byte)local_178) != 0)) {
            iVar7 = iVar7 + 1;
          }
          else if (iVar6 == -1) {
            iVar7 = iVar7 + 1;
            iVar6 = iVar1;
          }
          else {
            iVar4 = iVar4 + -1;
            iVar7 = 0;
            iVar6 = -1;
          }
        }
        lVar8 = lVar8 + 1;
      }
      if (iVar7 != 2) {
        local_178._4_4_ = (int)((ulong)local_d0 >> 0x20);
        if ((iVar4 == local_178._4_4_ + 1) || ((iVar7 < 2 && (local_178._4_4_ + 1 < iVar4)))) {
          iVar6 = -1;
          iVar4 = local_178._4_4_;
        }
      }
      *(char *)((long)local_1d8.shared_alloc_.direct_ptr + uVar3) = (char)iVar4;
      *(int *)((long)local_1c8.shared_alloc_.direct_ptr + uVar3 * 4) = iVar6;
    }
    local_178 = peVar2;
    project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)
    ::$_0::~__0((__0 *)&local_1d8);
  }
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&local_130);
  project_classification(Omega_h::Mesh*,int,Omega_h::Write<signed_char>,Omega_h::Write<int>,bool)::
  $_0::~__0((__0 *)&f);
  Write<int>::~Write(&high_class_id.write_);
  Write<signed_char>::~Write(&high_class_dim.write_);
  Write<int>::~Write(&lh2h.write_);
  Write<int>::~Write(&l2lh.write_);
  Adj::~Adj(&l2h);
  return;
}

Assistant:

void project_classification(Mesh* mesh, Int ent_dim, Write<I8> class_dim,
    Write<ClassId> class_id, bool relaxed) {
  auto l2h = mesh->ask_up(ent_dim, ent_dim + 1);
  auto l2lh = l2h.a2ab;
  auto lh2h = l2h.ab2b;
  auto high_class_dim = mesh->get_array<I8>(ent_dim + 1, "class_dim");
  auto high_class_id = mesh->get_array<ClassId>(ent_dim + 1, "class_id");
  auto f = OMEGA_H_LAMBDA(LO l) {
    Int best_dim = class_dim[l];
    auto best_id = class_id[l];
    Int nadj = 0;
    for (auto lh = l2lh[l]; lh < l2lh[l + 1]; ++lh) {
      auto h = lh2h[lh];
      Int high_dim = high_class_dim[h];
      auto high_id = high_class_id[h];
      if (high_dim < best_dim) {
        best_dim = high_dim;
        best_id = high_id;
        nadj = 1;
      } else if (high_dim == best_dim) {
        if (high_id != best_id && (!relaxed || high_id != -1)) {
          if (best_id == -1) {
            best_id = high_id;
            ++nadj;
          } else {
            --best_dim;
            best_id = -1;
            nadj = 0;
          }
        } else {
          ++nadj;
        }
      }
    }
    if ((nadj != 2 && best_dim == ent_dim + 1) ||
        (nadj < 2 && best_dim > ent_dim + 1)) {
      best_dim = ent_dim;
      best_id = -1;
    }
    class_dim[l] = static_cast<I8>(best_dim);
    class_id[l] = best_id;
  };
  parallel_for(mesh->nents(ent_dim), f, "project_classification");
}